

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O1

void pffft_real_finalize(int Ncvec,v4sf *in,v4sf *out,v4sf *e)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  long lVar12;
  v4sf *pafVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  
  iVar11 = Ncvec + 3;
  if (-1 < Ncvec) {
    iVar11 = Ncvec;
  }
  if (in != out) {
    fVar25 = in[7][0];
    fVar34 = in[7][1];
    fVar36 = in[7][2];
    fVar19 = in[7][3];
    pafVar13 = in + (long)(Ncvec * 2) + -1;
    fVar8 = (*pafVar13)[0];
    fVar15 = (*pafVar13)[1];
    fVar9 = (*pafVar13)[2];
    fVar10 = (*pafVar13)[3];
    fVar24 = (*in)[0];
    fVar39 = (*in)[1];
    fVar16 = (*in)[2];
    fVar17 = (*in)[3];
    fVar29 = (*e)[0] * 0.0 - e[1][0] * 0.0;
    fVar30 = in[1][1] * (*e)[1] - e[1][1] * in[2][1];
    fVar31 = in[3][1] * (*e)[2] - e[1][2] * in[4][1];
    fVar32 = in[5][1] * (*e)[3] - e[1][3] * in[6][1];
    fVar33 = (*e)[0] * 0.0 + e[1][0] * 0.0;
    fVar35 = in[2][1] * (*e)[1] + in[1][1] * e[1][1];
    fVar37 = in[4][1] * (*e)[2] + in[3][1] * e[1][2];
    fVar38 = in[6][1] * (*e)[3] + in[5][1] * e[1][3];
    fVar40 = e[2][0] * 0.0 - e[3][0] * 0.0;
    fVar42 = in[1][2] * e[2][1] - e[3][1] * in[2][2];
    fVar44 = in[3][2] * e[2][2] - e[3][2] * in[4][2];
    fVar46 = in[5][2] * e[2][3] - e[3][3] * in[6][2];
    fVar48 = e[2][0] * 0.0 + e[3][0] * 0.0;
    fVar50 = in[2][2] * e[2][1] + in[1][2] * e[3][1];
    fVar52 = in[4][2] * e[2][2] + in[3][2] * e[3][2];
    fVar54 = in[6][2] * e[2][3] + in[5][2] * e[3][3];
    fVar18 = e[4][0] * 0.0 - e[5][0] * 0.0;
    fVar20 = in[1][3] * e[4][1] - e[5][1] * in[2][3];
    fVar21 = in[3][3] * e[4][2] - e[5][2] * in[4][3];
    fVar22 = in[5][3] * e[4][3] - e[5][3] * in[6][3];
    fVar23 = e[4][0] * 0.0 + e[5][0] * 0.0;
    fVar26 = in[2][3] * e[4][1] + in[1][3] * e[5][1];
    fVar27 = in[4][3] * e[4][2] + in[3][3] * e[5][2];
    fVar28 = in[6][3] * e[4][3] + in[5][3] * e[5][3];
    fVar56 = fVar40 + 0.0;
    fVar57 = in[1][0] + fVar42;
    fVar58 = in[3][0] + fVar44;
    fVar59 = in[5][0] + fVar46;
    fVar40 = 0.0 - fVar40;
    fVar42 = in[1][0] - fVar42;
    fVar44 = in[3][0] - fVar44;
    fVar46 = in[5][0] - fVar46;
    fVar41 = fVar29 + fVar18;
    fVar43 = fVar30 + fVar20;
    fVar45 = fVar31 + fVar21;
    fVar47 = fVar32 + fVar22;
    fVar18 = fVar18 - fVar29;
    fVar20 = fVar20 - fVar30;
    fVar21 = fVar21 - fVar31;
    fVar22 = fVar22 - fVar32;
    fVar29 = fVar48 + 0.0;
    fVar30 = in[2][0] + fVar50;
    fVar31 = in[4][0] + fVar52;
    fVar32 = in[6][0] + fVar54;
    fVar48 = 0.0 - fVar48;
    fVar50 = in[2][0] - fVar50;
    fVar52 = in[4][0] - fVar52;
    fVar54 = in[6][0] - fVar54;
    fVar49 = fVar33 + fVar23;
    fVar51 = fVar35 + fVar26;
    fVar53 = fVar37 + fVar27;
    fVar55 = fVar38 + fVar28;
    fVar23 = fVar23 - fVar33;
    fVar26 = fVar26 - fVar35;
    fVar27 = fVar27 - fVar37;
    fVar28 = fVar28 - fVar38;
    (*out)[0] = fVar56 + fVar41;
    (*out)[1] = fVar57 + fVar43;
    (*out)[2] = fVar58 + fVar45;
    (*out)[3] = fVar59 + fVar47;
    out[1][0] = fVar29 + fVar49;
    out[1][1] = fVar30 + fVar51;
    out[1][2] = fVar31 + fVar53;
    out[1][3] = fVar32 + fVar55;
    out[2][0] = fVar40 + fVar23;
    out[2][1] = fVar42 + fVar26;
    out[2][2] = fVar44 + fVar27;
    out[2][3] = fVar46 + fVar28;
    out[3][0] = fVar18 - fVar48;
    out[3][1] = fVar20 - fVar50;
    out[3][2] = fVar21 - fVar52;
    out[3][3] = fVar22 - fVar54;
    out[4][0] = fVar40 - fVar23;
    out[4][1] = fVar42 - fVar26;
    out[4][2] = fVar44 - fVar27;
    out[4][3] = fVar46 - fVar28;
    out[5][0] = fVar48 + fVar18;
    out[5][1] = fVar50 + fVar20;
    out[5][2] = fVar52 + fVar21;
    out[5][3] = fVar54 + fVar22;
    out[6][0] = fVar56 - fVar41;
    out[6][1] = fVar57 - fVar43;
    out[6][2] = fVar58 - fVar45;
    out[6][3] = fVar59 - fVar47;
    out[7][0] = fVar49 - fVar29;
    out[7][1] = fVar51 - fVar30;
    out[7][2] = fVar53 - fVar31;
    out[7][3] = fVar55 - fVar32;
    fVar18 = fVar24 + fVar16;
    fVar20 = fVar39 + fVar17;
    (*out)[0] = fVar18 + fVar20;
    out[1][0] = fVar18 - fVar20;
    out[4][0] = fVar24 - fVar16;
    out[5][0] = fVar17 - fVar39;
    fVar24 = fVar15 - fVar10;
    out[2][0] = fVar24 * 0.70710677 + fVar8;
    fVar15 = (fVar10 + fVar15) * -0.70710677;
    out[3][0] = fVar15 - fVar9;
    out[6][0] = fVar24 * -0.70710677 + fVar8;
    out[7][0] = fVar15 + fVar9;
    if (7 < Ncvec) {
      uVar14 = 2;
      if (2 < iVar11 >> 2) {
        uVar14 = (ulong)(uint)(iVar11 >> 2);
      }
      pafVar13 = e + 0xb;
      lVar12 = 0;
      do {
        pfVar1 = (float *)((long)in[0xf] + lVar12);
        fVar8 = *pfVar1;
        fVar15 = pfVar1[1];
        fVar9 = pfVar1[2];
        fVar10 = pfVar1[3];
        pfVar1 = (float *)((long)in[8] + lVar12);
        pfVar2 = (float *)((long)in[9] + lVar12);
        pfVar3 = (float *)((long)in[10] + lVar12);
        pfVar4 = (float *)((long)in[0xb] + lVar12);
        pfVar5 = (float *)((long)in[0xc] + lVar12);
        pfVar6 = (float *)((long)in[0xd] + lVar12);
        pfVar7 = (float *)((long)in[0xe] + lVar12);
        fVar40 = fVar34 * pafVar13[-5][0] - pafVar13[-4][0] * pfVar1[1];
        fVar42 = pfVar2[1] * pafVar13[-5][1] - pafVar13[-4][1] * pfVar3[1];
        fVar44 = pfVar4[1] * pafVar13[-5][2] - pafVar13[-4][2] * pfVar5[1];
        fVar46 = pfVar6[1] * pafVar13[-5][3] - pafVar13[-4][3] * pfVar7[1];
        fVar48 = pfVar1[1] * pafVar13[-5][0] + fVar34 * pafVar13[-4][0];
        fVar50 = pfVar3[1] * pafVar13[-5][1] + pfVar2[1] * pafVar13[-4][1];
        fVar52 = pfVar5[1] * pafVar13[-5][2] + pfVar4[1] * pafVar13[-4][2];
        fVar54 = pfVar7[1] * pafVar13[-5][3] + pfVar6[1] * pafVar13[-4][3];
        fVar29 = fVar36 * pafVar13[-3][0] - pafVar13[-2][0] * pfVar1[2];
        fVar26 = pfVar2[2] * pafVar13[-3][1] - pafVar13[-2][1] * pfVar3[2];
        fVar27 = pfVar4[2] * pafVar13[-3][2] - pafVar13[-2][2] * pfVar5[2];
        fVar28 = pfVar6[2] * pafVar13[-3][3] - pafVar13[-2][3] * pfVar7[2];
        fVar34 = pfVar1[2] * pafVar13[-3][0] + fVar36 * pafVar13[-2][0];
        fVar36 = pfVar3[2] * pafVar13[-3][1] + pfVar2[2] * pafVar13[-2][1];
        fVar24 = pfVar5[2] * pafVar13[-3][2] + pfVar4[2] * pafVar13[-2][2];
        fVar39 = pfVar7[2] * pafVar13[-3][3] + pfVar6[2] * pafVar13[-2][3];
        fVar16 = fVar19 * pafVar13[-1][0] - (*pafVar13)[0] * pfVar1[3];
        fVar17 = pfVar2[3] * pafVar13[-1][1] - (*pafVar13)[1] * pfVar3[3];
        fVar18 = pfVar4[3] * pafVar13[-1][2] - (*pafVar13)[2] * pfVar5[3];
        fVar20 = pfVar6[3] * pafVar13[-1][3] - (*pafVar13)[3] * pfVar7[3];
        fVar19 = pfVar1[3] * pafVar13[-1][0] + fVar19 * (*pafVar13)[0];
        fVar21 = pfVar3[3] * pafVar13[-1][1] + pfVar2[3] * (*pafVar13)[1];
        fVar22 = pfVar5[3] * pafVar13[-1][2] + pfVar4[3] * (*pafVar13)[2];
        fVar23 = pfVar7[3] * pafVar13[-1][3] + pfVar6[3] * (*pafVar13)[3];
        fVar41 = fVar25 + fVar29;
        fVar43 = *pfVar2 + fVar26;
        fVar45 = *pfVar4 + fVar27;
        fVar47 = *pfVar6 + fVar28;
        fVar25 = fVar25 - fVar29;
        fVar26 = *pfVar2 - fVar26;
        fVar27 = *pfVar4 - fVar27;
        fVar28 = *pfVar6 - fVar28;
        fVar29 = fVar40 + fVar16;
        fVar30 = fVar42 + fVar17;
        fVar31 = fVar44 + fVar18;
        fVar32 = fVar46 + fVar20;
        fVar16 = fVar16 - fVar40;
        fVar17 = fVar17 - fVar42;
        fVar18 = fVar18 - fVar44;
        fVar20 = fVar20 - fVar46;
        fVar40 = *pfVar1 + fVar34;
        fVar42 = *pfVar3 + fVar36;
        fVar44 = *pfVar5 + fVar24;
        fVar46 = *pfVar7 + fVar39;
        fVar34 = *pfVar1 - fVar34;
        fVar36 = *pfVar3 - fVar36;
        fVar24 = *pfVar5 - fVar24;
        fVar39 = *pfVar7 - fVar39;
        fVar33 = fVar48 + fVar19;
        fVar35 = fVar50 + fVar21;
        fVar37 = fVar52 + fVar22;
        fVar38 = fVar54 + fVar23;
        fVar19 = fVar19 - fVar48;
        fVar21 = fVar21 - fVar50;
        fVar22 = fVar22 - fVar52;
        fVar23 = fVar23 - fVar54;
        pfVar1 = (float *)((long)out[8] + lVar12);
        *pfVar1 = fVar41 + fVar29;
        pfVar1[1] = fVar43 + fVar30;
        pfVar1[2] = fVar45 + fVar31;
        pfVar1[3] = fVar47 + fVar32;
        pfVar1 = (float *)((long)out[9] + lVar12);
        *pfVar1 = fVar40 + fVar33;
        pfVar1[1] = fVar42 + fVar35;
        pfVar1[2] = fVar44 + fVar37;
        pfVar1[3] = fVar46 + fVar38;
        pfVar1 = (float *)((long)out[10] + lVar12);
        *pfVar1 = fVar25 + fVar19;
        pfVar1[1] = fVar26 + fVar21;
        pfVar1[2] = fVar27 + fVar22;
        pfVar1[3] = fVar28 + fVar23;
        pfVar1 = (float *)((long)out[0xb] + lVar12);
        *pfVar1 = fVar16 - fVar34;
        pfVar1[1] = fVar17 - fVar36;
        pfVar1[2] = fVar18 - fVar24;
        pfVar1[3] = fVar20 - fVar39;
        pfVar1 = (float *)((long)out[0xc] + lVar12);
        *pfVar1 = fVar25 - fVar19;
        pfVar1[1] = fVar26 - fVar21;
        pfVar1[2] = fVar27 - fVar22;
        pfVar1[3] = fVar28 - fVar23;
        pfVar1 = (float *)((long)out[0xd] + lVar12);
        *pfVar1 = fVar34 + fVar16;
        pfVar1[1] = fVar36 + fVar17;
        pfVar1[2] = fVar24 + fVar18;
        pfVar1[3] = fVar39 + fVar20;
        pfVar1 = (float *)((long)out[0xe] + lVar12);
        *pfVar1 = fVar41 - fVar29;
        pfVar1[1] = fVar43 - fVar30;
        pfVar1[2] = fVar45 - fVar31;
        pfVar1[3] = fVar47 - fVar32;
        pfVar1 = (float *)((long)out[0xf] + lVar12);
        *pfVar1 = fVar33 - fVar40;
        pfVar1[1] = fVar35 - fVar42;
        pfVar1[2] = fVar37 - fVar44;
        pfVar1[3] = fVar38 - fVar46;
        pafVar13 = pafVar13 + 6;
        lVar12 = lVar12 + 0x80;
        fVar25 = fVar8;
        fVar34 = fVar15;
        fVar36 = fVar9;
        fVar19 = fVar10;
      } while (uVar14 * 0x80 + -0x80 != lVar12);
    }
    return;
  }
  __assert_fail("in != out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                ,0x5cc,"void pffft_real_finalize(int, const v4sf *, v4sf *, const v4sf *)");
}

Assistant:

static NEVER_INLINE(void) pffft_real_finalize(int Ncvec, const v4sf *in, v4sf *out, const v4sf *e) {
  int k, dk = Ncvec/SIMD_SZ; // number of 4x4 matrix blocks
  /* fftpack order is f0r f1r f1i f2r f2i ... f(n-1)r f(n-1)i f(n)r */

  v4sf_union cr, ci, *uout = (v4sf_union*)out;
  v4sf save = in[7], zero=VZERO();
  float xr0, xi0, xr1, xi1, xr2, xi2, xr3, xi3;
  static const float s = M_SQRT2/2;

  cr.v = in[0]; ci.v = in[Ncvec*2-1];
  assert(in != out);
  pffft_real_finalize_4x4(&zero, &zero, in+1, e, out);

  /*
    [cr0 cr1 cr2 cr3 ci0 ci1 ci2 ci3]

    [Xr(1)]  ] [1   1   1   1   0   0   0   0]
    [Xr(N/4) ] [0   0   0   0   1   s   0  -s]
    [Xr(N/2) ] [1   0  -1   0   0   0   0   0]
    [Xr(3N/4)] [0   0   0   0   1  -s   0   s]
    [Xi(1)   ] [1  -1   1  -1   0   0   0   0]
    [Xi(N/4) ] [0   0   0   0   0  -s  -1  -s]
    [Xi(N/2) ] [0  -1   0   1   0   0   0   0]
    [Xi(3N/4)] [0   0   0   0   0  -s   1  -s]
  */

  xr0=(cr.f[0]+cr.f[2]) + (cr.f[1]+cr.f[3]); uout[0].f[0] = xr0;
  xi0=(cr.f[0]+cr.f[2]) - (cr.f[1]+cr.f[3]); uout[1].f[0] = xi0;
  xr2=(cr.f[0]-cr.f[2]);                     uout[4].f[0] = xr2;
  xi2=(cr.f[3]-cr.f[1]);                     uout[5].f[0] = xi2;
  xr1= ci.f[0] + s*(ci.f[1]-ci.f[3]);        uout[2].f[0] = xr1;
  xi1=-ci.f[2] - s*(ci.f[1]+ci.f[3]);        uout[3].f[0] = xi1;
  xr3= ci.f[0] - s*(ci.f[1]-ci.f[3]);        uout[6].f[0] = xr3;
  xi3= ci.f[2] - s*(ci.f[1]+ci.f[3]);        uout[7].f[0] = xi3; 

  for (k=1; k < dk; ++k) {
    v4sf save_next = in[8*k+7];
    pffft_real_finalize_4x4(&save, &in[8*k+0], in + 8*k+1,
                           e + k*6, out + k*8);
    save = save_next;
  }

}